

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar16;
  pointer pMVar11;
  int *piVar12;
  void *pvVar13;
  Allocator *pAVar14;
  size_t sVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  byte bVar40;
  byte bVar41;
  int iVar42;
  int iVar43;
  Layer *pLVar44;
  Mat *this_00;
  _func_int **pp_Var45;
  byte bVar46;
  int iVar47;
  pointer pMVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  byte bVar52;
  pointer pMVar53;
  ulong uVar54;
  ulong uVar55;
  int iVar56;
  long lVar57;
  int k;
  uint uVar58;
  uint uVar59;
  long lVar60;
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  ulong uVar64;
  undefined1 (*pauVar65) [16];
  _func_int **pp_Var66;
  long lVar67;
  _func_int **pp_Var68;
  _func_int **pp_Var69;
  uint uVar70;
  undefined1 (*pauVar71) [16];
  int iVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ParamDict pd;
  Allocator *local_1b8;
  int iStack_1b0;
  int iStack_1ac;
  undefined8 uStack_1a8;
  int local_1a0 [2];
  size_t local_198;
  void *local_190;
  undefined4 uStack_188;
  undefined4 uStack_184;
  size_t local_180;
  int local_178;
  Allocator *local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 uStack_160;
  int local_158;
  size_t local_150;
  ulong local_148;
  long local_140;
  int TILE_M;
  ParamDict pd_5;
  size_t local_118;
  Allocator *local_108;
  int local_100;
  int iStack_fc;
  undefined8 uStack_f8;
  int local_f0;
  size_t local_e8;
  int TILE_K;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar44 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar44->_vptr_Layer[2])(pLVar44,&pd);
    break;
  case 2:
    pLVar44 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar44->_vptr_Layer[2])(pLVar44,&pd);
    break;
  case 3:
    pLVar44 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar44->_vptr_Layer[2])(pLVar44,&pd);
    break;
  case 4:
    pLVar44 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar44->_vptr_Layer[2])(pLVar44,&pd);
    break;
  case 5:
    pLVar44 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar44->_vptr_Layer[2])(pLVar44,&pd);
    break;
  case 6:
    pLVar44 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar44->_vptr_Layer[2])(pLVar44,&pd);
    break;
  default:
    pLVar44 = (Layer *)0x0;
    goto LAB_00151417;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar44->_vptr_Layer[4])(pLVar44);
LAB_00151417:
  this->activation = pLVar44;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar10 = (this->super_Convolution).kernel_w;
  uVar16 = (this->super_Convolution).kernel_h;
  uVar64 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar16 * uVar10);
  uVar4 = (this->super_Convolution).num_output;
  uVar64 = (long)((ulong)(uint)((int)uVar64 >> 0x1f) << 0x20 | uVar64 & 0xffffffff) /
           (long)(int)uVar4;
  if ((((uVar10 == uVar16 && opt->use_packing_layout == false) &&
       (iVar56 = (this->super_Convolution).dilation_w, iVar56 != 1)) &&
      ((this->super_Convolution).dilation_h == iVar56)) &&
     (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)))) {
    pLVar44 = create_layer_cpu(6);
    this->convolution_dilation1 = pLVar44;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
    ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
    ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
    ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    if ((this->super_Convolution).bias_term == 0) {
      local_198 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      iStack_1ac = 0;
      uStack_1a8._0_4_ = 0;
      uStack_1a8._4_4_ = 0;
      local_1a0[0] = 0;
      if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
        piVar12 = (this->super_Convolution).weight_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
        piVar12 = (this->super_Convolution).weight_data.refcount;
        pd.d._0_4_ = SUB84(piVar12,0);
        pd.d._4_4_ = (undefined4)((ulong)piVar12 >> 0x20);
        local_1b8 = (this->super_Convolution).weight_data.allocator;
        uVar34 = (this->super_Convolution).weight_data.dims;
        uVar35 = (this->super_Convolution).weight_data.w;
        uStack_1a8._0_4_ = (this->super_Convolution).weight_data.h;
        uStack_1a8._4_4_ = (this->super_Convolution).weight_data.d;
        local_1a0[0] = (this->super_Convolution).weight_data.c;
        local_198 = (this->super_Convolution).weight_data.cstep;
        iStack_1b0 = uVar34;
        iStack_1ac = uVar35;
      }
      pLVar44 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
      (*pLVar44->_vptr_Layer[3])(pLVar44,&TILE_M);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
      piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_198 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      iStack_1ac = 0;
      uStack_1a8._0_4_ = 0;
      uStack_1a8._4_4_ = 0;
      local_1a0[0] = 0;
      if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
        piVar12 = (this->super_Convolution).weight_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
        piVar12 = (this->super_Convolution).weight_data.refcount;
        pd.d._0_4_ = SUB84(piVar12,0);
        pd.d._4_4_ = (undefined4)((ulong)piVar12 >> 0x20);
        local_1b8 = (this->super_Convolution).weight_data.allocator;
        uVar30 = (this->super_Convolution).weight_data.dims;
        uVar31 = (this->super_Convolution).weight_data.w;
        uStack_1a8._0_4_ = (this->super_Convolution).weight_data.h;
        uStack_1a8._4_4_ = (this->super_Convolution).weight_data.d;
        local_1a0[0] = (this->super_Convolution).weight_data.c;
        local_198 = (this->super_Convolution).weight_data.cstep;
        iStack_1b0 = uVar30;
        iStack_1ac = uVar31;
      }
      local_150 = 0;
      local_158 = 0;
      uStack_160 = 0;
      uStack_164 = 0;
      uStack_168 = 0;
      local_170 = (Allocator *)0x0;
      local_178 = 0;
      local_180 = 0;
      uStack_184 = 0;
      uStack_188 = 0;
      local_190 = (void *)0x0;
      if ((Mat *)&local_190 != &(this->super_Convolution).bias_data) {
        piVar12 = (this->super_Convolution).bias_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        local_190 = (this->super_Convolution).bias_data.data;
        piVar12 = (this->super_Convolution).bias_data.refcount;
        uStack_188 = SUB84(piVar12,0);
        uStack_184 = (undefined4)((ulong)piVar12 >> 0x20);
        local_180 = (this->super_Convolution).bias_data.elemsize;
        local_178 = (this->super_Convolution).bias_data.elempack;
        local_170 = (this->super_Convolution).bias_data.allocator;
        uVar32 = (this->super_Convolution).bias_data.dims;
        uVar33 = (this->super_Convolution).bias_data.w;
        uStack_160._0_4_ = (this->super_Convolution).bias_data.h;
        uStack_160._4_4_ = (this->super_Convolution).bias_data.d;
        local_158 = (this->super_Convolution).bias_data.c;
        local_150 = (this->super_Convolution).bias_data.cstep;
        uStack_168 = uVar32;
        uStack_164 = uVar33;
      }
      pLVar44 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
      (*pLVar44->_vptr_Layer[3])(pLVar44,&TILE_M);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
      lVar73 = 0x48;
      do {
        piVar12 = *(int **)((long)&pd.d + lVar73);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar13 = *(void **)((long)&pd._vptr_ParamDict + lVar73);
            if (*(long **)((long)&local_1b8 + lVar73) == (long *)0x0) {
              if (pvVar13 != (void *)0x0) {
                free(pvVar13);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_1b8 + lVar73) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_198 + lVar73) = 0;
        *(undefined1 (*) [16])((long)&pd.d + lVar73 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar73) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&iStack_1b0 + lVar73) = (undefined1  [16])0x0;
        *(undefined4 *)((long)local_1a0 + lVar73) = 0;
        lVar73 = lVar73 + -0x48;
      } while (lVar73 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      piVar12 = (this->super_Convolution).weight_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pvVar13 = (this->super_Convolution).weight_data.data;
          pAVar14 = (this->super_Convolution).weight_data.allocator;
          if (pAVar14 == (Allocator *)0x0) {
            if (pvVar13 != (void *)0x0) {
              free(pvVar13);
            }
          }
          else {
            (*pAVar14->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
           (undefined1  [16])0x0;
      (this->super_Convolution).weight_data.data = (void *)0x0;
      (this->super_Convolution).weight_data.refcount = (int *)0x0;
      (this->super_Convolution).weight_data.dims = 0;
      (this->super_Convolution).weight_data.w = 0;
      (this->super_Convolution).weight_data.h = 0;
      (this->super_Convolution).weight_data.d = 0;
      (this->super_Convolution).weight_data.c = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  iVar56 = 1;
  iVar72 = 1;
  if (opt->use_packing_layout != false) {
    iVar56 = (uint)((uVar64 & 3) == 0) * 3 + 1;
    iVar72 = (uint)((uVar4 & 3) == 0) * 3 + 1;
  }
  bVar52 = opt->use_winograd23_convolution;
  iVar43 = (int)uVar64;
  if ((((bool)bVar52 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar39 = false;
  }
  else {
    bVar39 = 8 < (int)uVar4 || 8 < iVar43;
  }
  auVar77._0_4_ = -(uint)(uVar10 == 3);
  auVar77._4_4_ = -(uint)(uVar16 == 3);
  auVar77._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar77._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar47 = movmskps((int)this,auVar77);
  if ((((iVar47 == 0xf) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar39)))) {
    pMVar11 = (this->super_Convolution).super_Layer.bottom_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((pMVar11 ==
          (this->super_Convolution).super_Layer.bottom_shapes.
          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
          _M_finish) || (pMVar11->w == 0)) || (pMVar11->h == 0)) {
      pMVar48 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar53 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (((pMVar48 != pMVar53) && (pMVar48->w != 0)) && (pMVar48->h != 0)) goto LAB_00151999;
      if ((((int)uVar4 < 0x21) && (opt->use_winograd63_convolution != false)) && (iVar43 < 0x21)) {
LAB_00151e3b:
        conv3x3s1_winograd63_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,iVar43,uVar4
                   ,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_00151db3;
LAB_00151d7c:
        conv3x3s1_winograd43_transform_kernel
                  (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,iVar43,uVar4
                   ,opt);
      }
    }
    else {
      pMVar48 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar53 = (this->super_Convolution).super_Layer.top_shapes.
                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish;
LAB_00151999:
      if (((pMVar48 == pMVar53) || (iVar56 = pMVar48->w, iVar56 == 0)) ||
         (iVar72 = pMVar48->h, iVar72 == 0)) {
        iVar56 = pMVar11->w;
        iVar72 = pMVar11->h;
        iVar47 = (this->super_Convolution).pad_left;
        iVar7 = (this->super_Convolution).pad_right;
        if (((iVar7 < 1 && iVar47 < 1) && (iVar8 = (this->super_Convolution).pad_top, iVar8 < 1)) &&
           (iVar9 = (this->super_Convolution).pad_bottom, iVar9 < 1)) {
          if ((iVar9 == -0xe9 && (iVar8 == -0xe9 && (iVar7 == -0xe9 && iVar47 == -0xe9))) ||
             (iVar9 == -0xea && (iVar8 == -0xea && (iVar7 == -0xea && iVar47 == -0xea))))
          goto LAB_001519c1;
        }
        else {
          iVar56 = iVar47 + iVar56 + iVar7;
          iVar72 = iVar72 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom
          ;
        }
      }
      else {
LAB_001519c1:
        iVar56 = iVar56 + 2;
        iVar72 = iVar72 + 2;
      }
      bVar40 = test_prefer_winograd63(iVar43,uVar4,iVar56,iVar72);
      bVar39 = test_prefer_winograd23(iVar43,uVar4,iVar56,iVar72);
      bVar46 = bVar39 & bVar52;
      if (!bVar39) {
        bVar52 = bVar40;
      }
      if ((bool)bVar40) {
        bVar41 = opt->use_winograd63_convolution;
        if ((bVar52 & bVar41) != 0) goto LAB_00151d39;
LAB_00151d55:
        if (opt->use_winograd43_convolution == false) {
          if (bVar46 == 0 && opt->use_winograd63_convolution == true) {
            bVar40 = bVar41 | opt->use_winograd63_convolution;
LAB_00151e34:
            if (bVar40 != 0) goto LAB_00151e3b;
            goto LAB_00151e56;
          }
        }
        else if (bVar46 == 0) goto LAB_00151d7c;
      }
      else {
        if (bVar52 == 0) {
          bVar41 = 0;
          goto LAB_00151d55;
        }
LAB_00151d39:
        if (bVar46 == 0) goto LAB_00151e34;
      }
LAB_00151db3:
      conv3x3s1_winograd23_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,iVar43,uVar4,
                 opt);
    }
LAB_00151e56:
    if (opt->lightmode != true) {
      return 0;
    }
    piVar12 = (this->super_Convolution).weight_data.refcount;
    if (piVar12 == (int *)0x0) goto LAB_00151ea8;
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 != 0) goto LAB_00151ea8;
    pvVar13 = (this->super_Convolution).weight_data.data;
    pAVar14 = (this->super_Convolution).weight_data.allocator;
  }
  else {
    iVar42 = get_cpu_level2_cache_size();
    uVar4 = (this->super_Convolution).num_output;
    iVar47 = (this->super_Convolution).kernel_w;
    iVar7 = (this->super_Convolution).kernel_h;
    iVar8 = (this->super_Convolution).dilation_w;
    iVar9 = (this->super_Convolution).dilation_h;
    iVar5 = (this->super_Convolution).stride_w;
    iVar6 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar42 < (int)(uVar4 * iVar47 * iVar7 * iVar8 * iVar9 * iVar5 * iVar6 * iVar43 * 8) ||
         (0x10 < iVar43 || 0x10 < (int)uVar4))) || (iVar7 == 1 && iVar47 == 1)) {
      this_00 = &(this->super_Convolution).weight_data;
      uVar70 = iVar7 * iVar47;
      uVar58 = uVar70 * iVar43;
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar4,0,uVar58,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar63 = (long)(int)(TILE_M + uVar4 + -1) / (long)TILE_M;
      lVar73 = 1;
      if ((uVar64 & 3) == 0) {
        lVar73 = (ulong)opt->use_packing_layout * 3 + 1;
      }
      local_198 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      iStack_1ac = 0;
      uStack_1a8._0_4_ = 0;
      uStack_1a8._4_4_ = 0;
      local_1a0[0] = 0;
      local_148 = (ulong)uVar58;
      if (uVar70 == 1) {
        Mat::reshape((Mat *)&pd_5,this_00,uVar58,uVar4,(Allocator *)0x0);
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + 1;
          UNLOCK();
        }
        piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = SUB84(pd_5.d,0);
        pd.d._4_4_ = (undefined4)((ulong)pd_5.d >> 0x20);
        local_1b8 = local_108;
        iStack_1b0 = local_100;
        iStack_1ac = iStack_fc;
        uStack_1a8 = uStack_f8;
        local_1a0[0] = local_f0;
        local_198 = local_e8;
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_00151f9c;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_00151f9c;
        if (local_108 != (Allocator *)0x0) {
          (*local_108->_vptr_Allocator[3])();
          goto LAB_00151f9c;
        }
      }
      else {
        Mat::reshape((Mat *)&pd_5,this_00,uVar70,iVar43,uVar4,(Allocator *)0x0);
        Mat::create((Mat *)&pd,(int)local_148,uVar4,4,(Allocator *)0x0);
        if (0 < (int)uVar4) {
          uVar64 = 0;
          do {
            if ((int)lVar73 <= iVar43) {
              pp_Var45 = (_func_int **)(local_118 * local_e8 * uVar64 + (long)pd_5._vptr_ParamDict);
              lVar60 = 0;
              pp_Var66 = pd._vptr_ParamDict;
              do {
                if (0 < (int)uVar70) {
                  uVar55 = 0;
                  lVar49 = lVar73;
                  pp_Var69 = pp_Var45;
                  pp_Var68 = pp_Var45;
                  do {
                    do {
                      *(undefined4 *)pp_Var66 = *(undefined4 *)pp_Var69;
                      pp_Var66 = (_func_int **)((long)pp_Var66 + 4);
                      lVar49 = lVar49 + -1;
                      pp_Var69 = (_func_int **)((long)pp_Var69 + (long)iStack_fc * local_118);
                    } while (lVar49 != 0);
                    uVar55 = uVar55 + 1;
                    pp_Var69 = (_func_int **)((long)pp_Var68 + 4);
                    lVar49 = lVar73;
                    pp_Var68 = pp_Var69;
                  } while (uVar55 != uVar70);
                }
                lVar60 = lVar60 + lVar73;
                pp_Var45 = (_func_int **)((long)pp_Var45 + (long)iStack_fc * local_118 * lVar73);
              } while (lVar60 < (long)((long)iVar43 - (ulong)((int)lVar73 - 1)));
            }
            uVar64 = uVar64 + 1;
          } while (uVar64 != uVar4);
        }
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_00151f9c;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_00151f9c;
        if (local_108 != (Allocator *)0x0) {
          (*local_108->_vptr_Allocator[3])();
          goto LAB_00151f9c;
        }
      }
      if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
        free(pd_5._vptr_ParamDict);
      }
LAB_00151f9c:
      uVar64 = uVar63 & 0xffffffff;
      local_b8 = (long)TILE_M;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,((int)local_148 + TILE_K + -1) / TILE_K,
                  (int)((uVar4 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
      if (0 < (int)uVar63) {
        iVar56 = (int)local_148;
        local_58 = (long)iVar56;
        local_60 = (long)TILE_K * 4;
        local_70 = local_b8 * 4;
        local_88 = 4;
        local_90 = 8;
        local_98 = 0xc;
        local_a0 = 1;
        local_a8 = 0;
        local_b0 = 0;
        uVar63 = 0;
        do {
          lVar73 = uVar63 * local_b8;
          uVar58 = uVar4 - (int)lVar73;
          if ((int)(uint)local_b8 < (int)uVar58) {
            uVar58 = (uint)local_b8;
          }
          if (0 < iVar56) {
            local_80 = (ulong)uVar58;
            local_40 = (long)(int)uVar58;
            uVar55 = local_148 & 0xffffffff;
            local_140 = 0;
            uVar76 = 0;
            do {
              iVar43 = (int)uVar55;
              iVar72 = iVar43;
              if (TILE_K < iVar43) {
                iVar72 = TILE_K;
              }
              uVar70 = iVar56 - (int)uVar76;
              if (TILE_K < (int)uVar70) {
                uVar70 = TILE_K;
              }
              sVar15 = (this->weight_sgemm_data).elemsize;
              pauVar65 = (undefined1 (*) [16])
                         ((long)(this->weight_sgemm_data).data +
                         (long)(this->weight_sgemm_data).w * sVar15 *
                         (long)(int)((long)((ulong)(uint)((int)uVar76 >> 0x1f) << 0x20 |
                                           uVar76 & 0xffffffff) / (long)TILE_K) +
                         (this->weight_sgemm_data).cstep * uVar63 * sVar15);
              uVar55 = 0;
              lVar60 = (long)iStack_1ac;
              if (3 < (int)uVar58) {
                lVar57 = local_b0 * lVar60 + local_140;
                lVar49 = lVar60 * 0x10;
                lVar75 = local_88 * lVar60 + local_140;
                lVar74 = local_90 * lVar60 + local_140;
                lVar67 = local_98 * lVar60 + local_140;
                uVar54 = 0;
                do {
                  if ((int)uVar70 < 4) {
                    uVar59 = 0;
                    lVar36 = uVar76 * 4 + (uVar54 + lVar73) * lVar60 * 4;
                    lVar37 = uVar76 * 4 + (lVar73 + 1 + uVar54) * lVar60 * 4;
                    lVar38 = uVar76 * 4 + (lVar73 + 2 + uVar54) * lVar60 * 4;
                    lVar50 = uVar76 * 4 + (lVar73 + uVar54 + 3) * lVar60 * 4;
                    local_48 = lVar57;
                  }
                  else {
                    iVar47 = 3;
                    lVar50 = 0;
                    pauVar62 = pauVar65;
                    do {
                      pauVar71 = pauVar62;
                      puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar50 + lVar57);
                      uVar19 = puVar1[1];
                      puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar50 + lVar75);
                      uVar20 = *puVar2;
                      uVar21 = puVar2[1];
                      puVar3 = (undefined4 *)((long)pd._vptr_ParamDict + lVar50 + lVar74);
                      uVar22 = *puVar3;
                      uVar23 = puVar3[1];
                      uVar24 = puVar3[2];
                      uVar25 = puVar3[3];
                      puVar3 = (undefined4 *)((long)pd._vptr_ParamDict + lVar50 + lVar67);
                      uVar26 = *puVar3;
                      uVar27 = puVar3[1];
                      uVar28 = puVar3[2];
                      uVar29 = puVar3[3];
                      auVar78._0_8_ = CONCAT44(puVar2[2],puVar1[2]);
                      auVar78._8_4_ = puVar1[3];
                      auVar78._12_4_ = puVar2[3];
                      pauVar62 = (undefined1 (*) [16])(pauVar65[4] + lVar50 * 4);
                      *(undefined4 *)pauVar62[-4] = *puVar1;
                      *(undefined4 *)(pauVar62[-4] + 4) = uVar20;
                      *(undefined4 *)(pauVar62[-4] + 8) = uVar22;
                      *(undefined4 *)(pauVar62[-4] + 0xc) = uVar26;
                      *(undefined4 *)pauVar62[-3] = uVar19;
                      *(undefined4 *)(pauVar62[-3] + 4) = uVar21;
                      *(undefined4 *)(pauVar62[-3] + 8) = uVar23;
                      *(undefined4 *)(pauVar62[-3] + 0xc) = uVar27;
                      auVar18._8_4_ = uVar24;
                      auVar18._0_8_ = auVar78._0_8_;
                      auVar18._12_4_ = uVar28;
                      pauVar62[-2] = auVar18;
                      auVar17._8_4_ = uVar25;
                      auVar17._0_8_ = auVar78._8_8_;
                      auVar17._12_4_ = uVar29;
                      pauVar62[-1] = auVar17;
                      lVar50 = lVar50 + 0x10;
                      iVar47 = iVar47 + 4;
                    } while (iVar47 < (int)uVar70);
                    pauVar65 = pauVar71 + 4;
                    lVar36 = lVar50 + lVar57;
                    lVar37 = lVar50 + lVar75;
                    lVar38 = lVar50 + lVar74;
                    lVar50 = lVar50 + lVar67;
                    uVar59 = uVar70 & 0xfffffffc;
                  }
                  if ((int)uVar59 < (int)uVar70) {
                    lVar51 = 0;
                    do {
                      *(undefined4 *)*pauVar65 =
                           *(undefined4 *)((long)pd._vptr_ParamDict + lVar51 * 4 + lVar36);
                      *(undefined4 *)(*pauVar65 + 4) =
                           *(undefined4 *)((long)pd._vptr_ParamDict + lVar51 * 4 + lVar37);
                      *(undefined4 *)(*pauVar65 + 8) =
                           *(undefined4 *)((long)pd._vptr_ParamDict + lVar51 * 4 + lVar38);
                      *(undefined4 *)(*pauVar65 + 0xc) =
                           *(undefined4 *)((long)pd._vptr_ParamDict + lVar51 * 4 + lVar50);
                      pauVar65 = pauVar65 + 1;
                      lVar51 = lVar51 + 1;
                    } while (iVar72 - uVar59 != (int)lVar51);
                  }
                  uVar55 = uVar54 + 4;
                  uVar61 = uVar54 + 7;
                  lVar57 = lVar57 + lVar49;
                  lVar75 = lVar75 + lVar49;
                  lVar74 = lVar74 + lVar49;
                  lVar67 = lVar67 + lVar49;
                  uVar54 = uVar55;
                } while (uVar61 < local_80);
              }
              if ((int)((uint)uVar55 | 1) < (int)uVar58) {
                uVar54 = uVar55 & 0xffffffff;
                lVar49 = local_140 + (local_a0 + uVar54) * lVar60 * 4;
                lVar57 = local_140 + (local_a8 + uVar54) * lVar60 * 4;
                do {
                  if ((int)uVar70 < 4) {
                    uVar59 = 0;
                    lVar74 = uVar76 * 4 + (uVar54 + lVar73) * lVar60 * 4;
                    lVar67 = uVar76 * 4 + (uVar54 + lVar73 + 1) * lVar60 * 4;
                  }
                  else {
                    iVar47 = 3;
                    lVar74 = 0;
                    pauVar62 = pauVar65;
                    do {
                      pauVar71 = pauVar62;
                      puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar74 + lVar57);
                      uVar21 = puVar1[1];
                      puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar74 + lVar49);
                      uVar19 = *puVar2;
                      uVar20 = puVar2[1];
                      auVar79._4_4_ = puVar2[2];
                      auVar79._0_4_ = puVar1[2];
                      auVar79._8_4_ = puVar1[3];
                      auVar79._12_4_ = puVar2[3];
                      puVar2 = (undefined4 *)(*pauVar65 + lVar74 * 2);
                      *puVar2 = *puVar1;
                      puVar2[1] = uVar19;
                      puVar2[2] = uVar21;
                      puVar2[3] = uVar20;
                      *(undefined1 (*) [16])(puVar2 + 4) = auVar79;
                      lVar74 = lVar74 + 0x10;
                      iVar47 = iVar47 + 4;
                      pauVar62 = (undefined1 (*) [16])(puVar2 + 8);
                    } while (iVar47 < (int)uVar70);
                    pauVar65 = pauVar71 + 2;
                    lVar67 = lVar74 + lVar49;
                    lVar74 = lVar74 + lVar57;
                    uVar59 = uVar70 & 0xfffffffc;
                  }
                  if ((int)uVar59 < (int)uVar70) {
                    lVar75 = 0;
                    do {
                      *(undefined4 *)*pauVar65 =
                           *(undefined4 *)((long)pd._vptr_ParamDict + lVar75 * 4 + lVar74);
                      *(undefined4 *)(*pauVar65 + 4) =
                           *(undefined4 *)((long)pd._vptr_ParamDict + lVar75 * 4 + lVar67);
                      pauVar65 = (undefined1 (*) [16])(*pauVar65 + 8);
                      lVar75 = lVar75 + 1;
                    } while (iVar72 - uVar59 != (int)lVar75);
                  }
                  uVar55 = uVar54 + 2;
                  lVar67 = uVar54 + 3;
                  lVar49 = lVar49 + lVar60 * 8;
                  lVar57 = lVar57 + lVar60 * 8;
                  uVar54 = uVar55;
                } while (lVar67 < local_40);
              }
              if ((int)uVar55 < (int)uVar58) {
                uVar55 = uVar55 & 0xffffffff;
                do {
                  pauVar62 = (undefined1 (*) [16])
                             ((long)pd._vptr_ParamDict + uVar76 * 4 + (uVar55 + lVar73) * lVar60 * 4
                             );
                  uVar59 = 0;
                  if (3 < (int)uVar70) {
                    iVar47 = 3;
                    do {
                      *pauVar65 = *pauVar62;
                      pauVar65 = pauVar65 + 1;
                      pauVar62 = pauVar62 + 1;
                      iVar47 = iVar47 + 4;
                      uVar59 = uVar70 & 0xfffffffc;
                    } while (iVar47 < (int)uVar70);
                  }
                  if ((int)uVar59 < (int)uVar70) {
                    lVar49 = 0;
                    do {
                      *(undefined4 *)*pauVar65 = *(undefined4 *)(*pauVar62 + lVar49 * 4);
                      pauVar65 = (undefined1 (*) [16])(*pauVar65 + 4);
                      lVar49 = lVar49 + 1;
                    } while (iVar72 - uVar59 != (int)lVar49);
                  }
                  uVar55 = uVar55 + 1;
                } while (uVar55 != local_80);
              }
              uVar76 = uVar76 + (long)TILE_K;
              local_140 = local_140 + local_60;
              uVar55 = (ulong)(uint)(iVar43 - TILE_K);
              local_78 = lVar73;
              local_50 = uVar63;
            } while ((long)uVar76 < local_58);
          }
          uVar63 = uVar63 + 1;
          local_b0 = local_b0 + local_70;
          local_88 = local_88 + local_70;
          local_90 = local_90 + local_70;
          local_98 = local_98 + local_70;
          local_a0 = local_a0 + local_b8;
          local_a8 = local_a8 + local_b8;
          local_68 = uVar64;
        } while (uVar63 != uVar64);
      }
      piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
      if (opt->lightmode == true) {
        piVar12 = (this->super_Convolution).weight_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar13 = (this->super_Convolution).weight_data.data;
            pAVar14 = (this->super_Convolution).weight_data.allocator;
            if (pAVar14 == (Allocator *)0x0) {
              if (pvVar13 != (void *)0x0) {
                free(pvVar13);
              }
            }
            else {
              (*pAVar14->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
             (undefined1  [16])0x0;
        this_00->data = (void *)0x0;
        this_00->refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
        return 0;
      }
      return 0;
    }
    if (((iVar5 == 1 &&
         (iVar9 == 1 &&
         ((iVar8 == 1 && iVar7 == 3) && (iVar47 == 3 && (iVar72 == 4 && iVar56 == 1))))) &&
         iVar6 == 1) ||
       ((iVar9 == 1 && ((iVar8 == 1 && iVar7 == 3) && (iVar47 == 3 && (iVar72 == 4 && iVar56 == 1)))
        ) && (iVar6 == 2 && iVar5 == 2))) {
      convolution_transform_kernel_packed_sse
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar43,uVar4,iVar47,
                 iVar7,iVar56,iVar72);
    }
    else {
      convolution_transform_kernel_packed
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar43,uVar4,iVar47,
                 iVar7);
    }
    if (opt->lightmode != true) {
      return 0;
    }
    piVar12 = (this->super_Convolution).weight_data.refcount;
    if (piVar12 == (int *)0x0) goto LAB_00151ea8;
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 != 0) goto LAB_00151ea8;
    pvVar13 = (this->super_Convolution).weight_data.data;
    pAVar14 = (this->super_Convolution).weight_data.allocator;
  }
  if (pAVar14 == (Allocator *)0x0) {
    if (pvVar13 != (void *)0x0) {
      free(pvVar13);
    }
  }
  else {
    (*pAVar14->_vptr_Allocator[3])();
  }
LAB_00151ea8:
  (this->super_Convolution).weight_data.cstep = 0;
  *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
       (undefined1  [16])0x0;
  (this->super_Convolution).weight_data.data = (void *)0x0;
  (this->super_Convolution).weight_data.refcount = (int *)0x0;
  (this->super_Convolution).weight_data.dims = 0;
  (this->super_Convolution).weight_data.w = 0;
  (this->super_Convolution).weight_data.h = 0;
  (this->super_Convolution).weight_data.d = 0;
  (this->super_Convolution).weight_data.c = 0;
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}